

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

wchar_t find_path(player *p,loc_conflict start,loc_conflict dest,int16_t **step_dirs)

{
  int iVar1;
  loc_conflict grid;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool forbid_traps;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  wchar_t wVar9;
  int ***pppiVar10;
  int **ppiVar11;
  priority_queue *qp;
  loc grid_00;
  loc_conflict lVar12;
  size_t sVar13;
  size_t sVar14;
  undefined4 extraout_var;
  wchar_t wVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  wchar_t unaff_R13D;
  long lVar20;
  int iVar21;
  wchar_t wVar22;
  loc_conflict lVar23;
  pfdistances_patched distances;
  wchar_t local_f4;
  loc_conflict local_d8;
  int16_t **local_d0;
  loc_conflict local_c8;
  wchar_t local_c0;
  wchar_t local_bc;
  int16_t *local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_a0;
  ulong local_98;
  loc_conflict local_90;
  loc_conflict local_88;
  wchar_t local_80;
  wchar_t local_7c;
  wchar_t local_78;
  uint local_74;
  pfdistances_patched local_70;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_d0 = step_dirs;
  if (((p->cave != (chunk_conflict2 *)0x0) &&
      (_Var3 = square_in_bounds((chunk_conflict *)p->cave,(loc)start), _Var3)) &&
     (_Var3 = square_in_bounds((chunk_conflict *)p->cave,(loc)dest), _Var3)) {
    _Var3 = loc_eq(start,dest);
    if (_Var3) {
      wVar15 = L'\0';
      goto LAB_001a6df0;
    }
    _Var3 = square_isknown((chunk_conflict *)p->cave,(loc)start);
    if (_Var3) {
      _Var3 = square_isknown((chunk_conflict *)p->cave,(loc)dest);
    }
    else {
      _Var3 = false;
    }
    _Var4 = is_valid_pf(p,dest,_Var3,true);
    forbid_traps = true;
    if (_Var4) {
LAB_001a652f:
      local_78 = convert_turn_penalty(L'\x10',p);
      local_7c = compute_locked_penalty(p);
      local_80 = compute_rubble_penalty(p);
      local_70.height = p->cave->height;
      if ((local_70.height < L'\x01') || (local_70.width = p->cave->width, local_70.width < L'\x01')
         ) {
        __assert_fail("height > 0 && width > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                      ,0x25c,
                      "void initialize_patched_distances(struct pfdistances_patched *, int, int)");
      }
      local_a8 = (ulong)start >> 0x20;
      local_98 = (ulong)dest >> 0x20;
      local_70.patch_size = L'\x10';
      local_70.patch_shift = L'\x04';
      local_70.patch_mask = L'\x0f';
      wVar22 = (((uint)local_70.height >> 4) + 1) - (uint)((local_70.height & 0xfU) == 0);
      wVar15 = (((uint)local_70.width >> 4) + 1) - (uint)((local_70.width & 0xfU) == 0);
      local_90 = dest;
      local_70.npatchy = wVar22;
      local_70.npatchx = wVar15;
      pppiVar10 = (int ***)mem_alloc((ulong)(uint)(wVar22 * 8));
      local_70.patches = pppiVar10;
      if (wVar22 != L'\0') {
        uVar18 = 0;
        do {
          ppiVar11 = (int **)mem_zalloc((ulong)(uint)(wVar15 * 8));
          pppiVar10[uVar18] = ppiVar11;
          uVar18 = uVar18 + 1;
        } while ((uint)wVar22 != uVar18);
      }
      lVar12 = local_90;
      iVar21 = (int)local_a8;
      iVar7 = (int)local_98;
      uVar5 = iVar21 - iVar7;
      uVar17 = -uVar5;
      if (0 < (int)uVar5) {
        uVar17 = uVar5;
      }
      iVar16 = start.x;
      iVar8 = local_90.x;
      uVar6 = iVar16 - iVar8;
      uVar5 = -uVar6;
      if (0 < (int)uVar6) {
        uVar5 = uVar6;
      }
      if (uVar5 < uVar17) {
        uVar5 = uVar17;
      }
      qp = qp_new((ulong)(uVar5 * 4 + 8));
      initialize_patch(&local_70,start,p,_Var3,forbid_traps);
      local_b0 = 0;
      set_patched_distance(&local_70,start,L'\0');
      iVar7 = iVar7 - iVar21;
      iVar1 = -iVar7;
      if (0 < iVar7) {
        iVar1 = iVar7;
      }
      iVar8 = iVar8 - iVar16;
      iVar7 = -iVar8;
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
      local_74 = iVar7 + 2 + iVar1;
      local_48 = (ulong)((iVar7 + iVar1) * 2 + 4);
      local_a0 = 0;
      local_d8.x = iVar16;
      local_d8.y = iVar21;
      local_c8 = start;
      do {
        wVar15 = (int)local_a0 + L'\x10';
        local_c0 = L'\xffffffff';
        lVar20 = 0;
        local_bc = L'\xffffffff';
        do {
          lVar23.y = local_d8.y;
          lVar23.x = local_d8.x;
          grid_00 = (loc)loc_sum(lVar23,(loc_conflict)ddgrid_ddd[lVar20]);
          _Var4 = loc_eq((loc_conflict)grid_00,lVar12);
          local_40 = lVar20;
          if (_Var4) {
            local_b8 = (int16_t *)mem_alloc(local_48);
            wVar22 = L'\x7fffffff';
            unaff_R13D = L'\0';
            uVar18 = (ulong)local_74;
            uVar19 = local_98;
            do {
              lVar23 = (loc_conflict)((ulong)lVar12 & 0xffffffff | uVar19 << 0x20);
              local_38 = uVar18;
              _Var4 = loc_eq(lVar23,start);
              if (_Var4) {
                if (local_d0 == (int16_t **)0x0) {
                  mem_free(local_b8);
                }
                else {
                  *local_d0 = local_b8;
                }
                goto LAB_001a6b2a;
              }
              local_f4 = 0xffffffff;
              local_88 = loc(-1,-1);
              uVar19 = (ulong)local_88 >> 0x20;
              lVar20 = 0;
              do {
                lVar12 = loc_sum(lVar23,(loc_conflict)ddgrid_ddd[lVar20]);
                _Var4 = has_patched_distance(&local_70,lVar12);
                if ((_Var4) &&
                   (wVar9 = get_patched_distance(&local_70,lVar12),
                   wVar9 < wVar22 && L'\xffffffff' < wVar9)) {
                  uVar19 = (ulong)lVar12 >> 0x20;
                  local_f4 = (wchar_t)lVar20;
                  wVar22 = wVar9;
                  local_88 = lVar12;
                }
                uVar18 = local_38;
                lVar12 = local_88;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 8);
              if (local_f4 < 0) {
                __assert_fail("best_k >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                              ,0x309,
                              "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                             );
              }
              if (((((wchar_t)uVar19 < L'\0') || (local_70.height <= (wchar_t)uVar19)) ||
                  (local_88.x < L'\0')) || (local_70.width <= local_88.x)) {
                __assert_fail("best_grid.y >= 0 && best_grid.y < distances->height && best_grid.x >= 0 && best_grid.x < distances->width"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                              ,0x30b,
                              "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                             );
              }
              wVar9 = (wchar_t)local_38;
              if (wVar9 < unaff_R13D) {
                __assert_fail("length <= allocated && allocated > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                              ,0x30d,
                              "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                             );
              }
              if (unaff_R13D == wVar9) {
                if (wVar9 < L'\x40000000') {
                  local_b8 = (int16_t *)mem_realloc(local_b8,(ulong)(uint)(wVar9 << 2));
                  uVar18 = (ulong)(uint)(wVar9 * 2);
                  goto LAB_001a68d7;
                }
                mem_free(local_b8);
                if (local_d0 != (int16_t **)0x0) {
                  *local_d0 = (int16_t *)0x0;
                }
                bVar2 = false;
              }
              else {
LAB_001a68d7:
                local_b8[unaff_R13D] = 10 - ddd[(uint)local_f4];
                unaff_R13D = unaff_R13D + L'\x01';
                bVar2 = true;
                lVar12 = local_88;
              }
              start = local_c8;
            } while (bVar2);
            unaff_R13D = L'\xffffffff';
LAB_001a6b2a:
            release_patched_distances(&local_70);
            qp_free(qp,(_func_void_void_ptr *)0x0);
            uVar17 = 1;
          }
          else {
            _Var4 = has_patched_distance(&local_70,(loc_conflict)grid_00);
            if (!_Var4) {
              initialize_patch(&local_70,(loc_conflict)grid_00,p,_Var3,forbid_traps);
            }
            wVar22 = get_patched_distance(&local_70,(loc_conflict)grid_00);
            if (wVar15 < wVar22) {
              uVar5 = lVar12.x - grid_00.x;
              uVar17 = -uVar5;
              if (0 < (int)uVar5) {
                uVar17 = uVar5;
              }
              uVar6 = (int)local_98 - grid_00.y;
              uVar5 = -uVar6;
              if (0 < (int)uVar6) {
                uVar5 = uVar6;
              }
              if (uVar5 < uVar17) {
                uVar5 = uVar17;
              }
              uVar17 = 6;
              if (uVar5 < 0x8000000) {
                wVar9 = uVar5 * 0x10 ^ 0x7fffffff;
                start = local_c8;
                if (wVar15 < wVar9) {
                  _Var4 = square_isknown((chunk_conflict *)p->cave,grid_00);
                  local_f4 = L'\0';
                  if ((_Var4) &&
                     (_Var4 = square_ispassable((chunk_conflict *)p->cave,grid_00), !_Var4)) {
                    _Var4 = square_iscloseddoor((chunk_conflict *)p->cave,grid_00);
                    if (_Var4) {
                      _Var4 = square_islockeddoor((chunk_conflict *)p->cave,grid_00);
                      local_f4 = local_78;
                      if (_Var4) {
                        local_f4 = local_7c;
                      }
                    }
                    else {
                      _Var4 = square_isrubble((chunk_conflict *)p->cave,grid_00);
                      local_f4 = L'\x7fffffff';
                      if (_Var4) {
                        local_f4 = local_80;
                      }
                    }
                    start = local_c8;
                    if ((wVar22 - local_f4 <= wVar15) || (wVar9 - local_f4 <= wVar15))
                    goto LAB_001a6c11;
                  }
                  wVar22 = local_bc;
                  start = local_c8;
                  if (L'\0' < local_bc) {
                    sVar14 = qp_len(qp);
                    sVar13 = qp_size(qp);
                    if (sVar14 == sVar13) {
                      sVar14 = qp_size(qp);
                      if (sVar14 == 0) {
                        __assert_fail("qp_size(pending) > 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                                      ,0x4e1,
                                      "int find_path(struct player *, struct loc, struct loc, int16_t **)"
                                     );
                      }
                      sVar14 = qp_size(qp);
                      if (-1 < (long)sVar14) {
                        sVar14 = qp_size(qp);
                        _Var4 = qp_resize(qp,sVar14 * 2,(_func_void_void_ptr *)0x0);
                        if (!_Var4) goto LAB_001a6b4c;
                      }
                      release_patched_distances(&local_70);
                      qp_free(qp,(_func_void_void_ptr *)0x0);
                      unaff_R13D = L'\xffffffff';
                      uVar17 = 1;
                      if (local_d0 != (int16_t **)0x0) {
                        *local_d0 = (int16_t *)0x0;
                      }
                      goto LAB_001a6c11;
                    }
LAB_001a6b4c:
                    qp_push_int(qp,local_c0,wVar22);
                  }
                  local_bc = grid_to_i((loc_conflict)grid_00,p->cave->width);
                  set_patched_distance(&local_70,(loc_conflict)grid_00,local_f4 + wVar15);
                  uVar17 = 0;
                  local_c0 = uVar5 * 0x10 + local_f4 + wVar15;
                }
              }
            }
            else {
              uVar17 = 6;
              if ((forbid_traps != false) &&
                 (_Var4 = square_isknown((chunk_conflict *)p->cave,grid_00), _Var4)) {
                _Var4 = square_isvisibletrap((chunk_conflict *)p->cave,grid_00);
                local_b0 = local_b0 & 0xff;
                if (_Var4) {
                  local_b0 = 1;
                }
              }
            }
          }
LAB_001a6c11:
          lVar12 = local_90;
          if ((uVar17 != 6) && (uVar17 != 0)) goto LAB_001a6dd9;
          lVar20 = local_40 + 1;
        } while (lVar20 != 8);
        if (local_bc < L'\0') {
          sVar14 = qp_len(qp);
          if (sVar14 != 0) {
            wVar15 = qp_pop_int(qp);
            goto LAB_001a6c73;
          }
          if (((forbid_traps == false) || (_Var4 = player_is_trapsafe(p), _Var4)) ||
             ((local_b0 & 1) == 0)) {
            if (_Var3 != false) {
              local_b0 = 0;
              forbid_traps = is_valid_pf(p,lVar12,false,true);
              clear_patched_distances(&local_70);
              initialize_patch(&local_70,start,p,false,forbid_traps);
              set_patched_distance(&local_70,start,L'\0');
              local_d8.y = (int)local_a8;
              _Var3 = false;
              goto LAB_001a6d9a;
            }
            release_patched_distances(&local_70);
            qp_free(qp,(_func_void_void_ptr *)0x0);
            unaff_R13D = L'\xffffffff';
            uVar17 = 1;
            if (local_d0 != (int16_t **)0x0) {
              *local_d0 = (int16_t *)0x0;
            }
          }
          else {
            clear_patched_distances(&local_70);
            forbid_traps = false;
            initialize_patch(&local_70,start,p,_Var3,false);
            set_patched_distance(&local_70,start,L'\0');
            local_d8.y = (int)local_a8;
LAB_001a6d9a:
            uVar17 = 0;
            local_a0 = 0;
            local_d8.x = start.x;
          }
        }
        else {
          wVar15 = qp_pushpop_int(qp,local_c0,local_bc);
LAB_001a6c73:
          i_to_grid(wVar15,p->cave->width,&local_d8);
          lVar12.y = local_d8.y;
          lVar12.x = local_d8.x;
          _Var4 = has_patched_distance(&local_70,lVar12);
          if (!_Var4) {
            __assert_fail("has_patched_distance(&distances, next)",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                          ,0x534,
                          "int find_path(struct player *, struct loc, struct loc, int16_t **)");
          }
          grid.y = local_d8.y;
          grid.x = local_d8.x;
          wVar15 = get_patched_distance(&local_70,grid);
          local_a0 = CONCAT44(extraout_var,wVar15);
          uVar17 = 0;
        }
LAB_001a6dd9:
        lVar12 = local_90;
        if ((uVar17 & 5) != 0) {
          return unaff_R13D;
        }
      } while( true );
    }
    forbid_traps = false;
    _Var4 = is_valid_pf(p,dest,_Var3,false);
    if (_Var4) goto LAB_001a652f;
  }
  wVar15 = L'\xffffffff';
LAB_001a6df0:
  if (local_d0 != (int16_t **)0x0) {
    *local_d0 = (int16_t *)0x0;
  }
  return wVar15;
}

Assistant:

int find_path(struct player *p, struct loc start, struct loc dest,
		int16_t **step_dirs)
{
	/*
	 * Store the grid at the head of the path in the queue and have
	 * separate storage for a distance array.  Initialize that distance
	 * array in patches of patch_size by patch_size to limit overhead from
	 * parts of the cave that are not traversed when moving to the
	 * destination.
	 */
	struct pfdistances_patched distances;
	struct priority_queue *pending;
	struct loc next;
	int dist_next;
	int unlocked_penalty, locked_penalty, rubble_penalty;
	bool only_known, forbid_traps, hit_trap;

	if (!p->cave || !square_in_bounds(p->cave, start)
			|| !square_in_bounds(p->cave, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}

	if (loc_eq(start, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/*
	 * If both the starting point and destination are remembered grids,
	 * first try paths that only traverse remembered grids.  If there are
	 * no such paths, then try ones that can include grids that are not
	 * remembered.
	 */
	only_known = square_isknown(p->cave, start)
		&& square_isknown(p->cave, dest);
	/*
	 * First try paths that do not go through grids with known visible
	 * traps.  If there are no such paths, then try paths that include
	 * known visible traps.
	 */
	if (is_valid_pf(p, dest, only_known, true)) {
		forbid_traps = true;
	} else if (is_valid_pf(p, dest, only_known, false)) {
		forbid_traps = false;
	} else {
		/*
		 * The destination is not reachable because it contains
		 * known terrain that pathfinding can not traverse.
		 */
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	/*
	 * Remember if the pathfinding would change because of a known visible
	 * trap.
	 */
	hit_trap = false;

	/* Precompute quantities to penalize traversing some terrain. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);

	initialize_patched_distances(&distances, p->cave->height,
		p->cave->width);

	/* Set up the priority queue of feasible paths to consider. */
	pending = qp_new(4 * (2 + MAX(ABS(start.y - dest.y),
		ABS(start.x - dest.x))));

	initialize_patch(&distances, start, p, only_known, forbid_traps);
	set_patched_distance(&distances, start, 0);
	next = start;
	dist_next = 0;
	while (1) {
		int add_grid = -1, add_priority = -1;
		/* This is the base distance to any neighbor. */
		int dist_this = dist_next + PF_SCL, i;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc this_grid = loc_sum(next, ddgrid_ddd[i]);
			int dist_stored, dist_remaining, penalty;

			if (loc_eq(this_grid, dest)) {
				/* Reached the destination. */
				int length = patched_distances_to_path(
					&distances, start, dest,
					step_dirs);

				release_patched_distances(&distances);
				qp_free(pending, NULL);
				return length;
			}

			if (!has_patched_distance(&distances, this_grid)) {
				initialize_patch(&distances, this_grid,
					p, only_known, forbid_traps);
			}
			dist_stored = get_patched_distance(&distances,
				this_grid);
			if (dist_stored <= dist_this) {
				/*
				 * Since it is unreachable or already has been
				 * visited by a path that is not longer than
				 * this one, do not need to consider it.  If
				 * not allowing traps and this grid is a known
				 * visible trap, remember that there is at
				 * least one trap that affects the pathfinding.
				 */
				if (forbid_traps && square_isknown(p->cave,
						this_grid)
						&& square_isvisibletrap(
						p->cave, this_grid)) {
					hit_trap = true;
				}
				continue;
			}

			/*
			 * Use A* pathfinding:  add an estimate (in this case
			 * the Chebyshev distance) to get from this_grid to
			 * the destination.
			 */
			dist_remaining = MAX(ABS(dest.x - this_grid.x),
				ABS(dest.y - this_grid.y));
			if (dist_remaining > INT_MAX / PF_SCL
					|| dist_this >= INT_MAX
					- PF_SCL * dist_remaining) {
				/*
				 * Can not reach the destination from this_grid
				 * in a reasonable number of turns, so skip
				 * it.
				 */
				continue;
			}
			dist_remaining *= PF_SCL;

			if (square_isknown(p->cave, this_grid)
					&& !square_ispassable(p->cave,
					this_grid)) {
				/*
				 * Penalize the distance for some known but
				 * impassable terrain.
				 */
				if (square_iscloseddoor(p->cave, this_grid)) {
					penalty = (square_islockeddoor(p->cave,
						this_grid)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave,
						this_grid)) {
					penalty = rubble_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					penalty = INT_MAX;
				}

				if (dist_this >= dist_stored - penalty
						|| dist_this >= INT_MAX -
						penalty - dist_remaining) {
					/*
					 * The penalty makes this path
					 * no shorter than what has already
					 * reached this grid or puts the
					 * destination out of reach.  Skip it.
					 */
					continue;
				}
			} else {
				penalty = 0;
			}

			/* Push what is pending onto the queue. */
			if (add_grid > 0) {
				if (qp_len(pending) == qp_size(pending)) {
					assert(qp_size(pending) > 0);
					if (qp_size(pending) > SIZE_MAX / 2 ||
							qp_resize(pending, 2
							* qp_size(pending),
							NULL)) {
						/*
						 * Could not resize so give
						 * up.
						 */
						release_patched_distances(
							&distances);
						qp_free(pending, NULL);
						if (step_dirs) {
							*step_dirs = NULL;
						}
						return -1;
					}
				}
				qp_push_int(pending, add_priority, add_grid);
			}
			add_grid = grid_to_i(this_grid, p->cave->width);
			add_priority = dist_this + penalty + dist_remaining;
			set_patched_distance(&distances, this_grid,
				dist_this + penalty);
		}

		if (add_grid >= 0) {
			i_to_grid(qp_pushpop_int(pending, add_priority,
				add_grid), p->cave->width, &next);
		} else {
			if (qp_len(pending) == 0) {
				/*
				 * Exhausted possible paths without reaching
				 * the destination.
				 */
				if (forbid_traps && !player_is_trapsafe(p)
						&& hit_trap) {
					/*
					 * Retry but allow grids that contain
					 * known visible traps.
					 */
					forbid_traps = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				if (only_known) {
					/*
					 * Retry but allow grids that are not
					 * in the player's memory.
					 */
					only_known = false;
					if (is_valid_pf(p, dest, false, true)) {
						forbid_traps = true;
					} else {
						forbid_traps = false;
					}
					hit_trap = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				/* Nothing to retry so give up. */
				release_patched_distances(&distances);
				qp_free(pending, NULL);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			i_to_grid(qp_pop_int(pending), p->cave->width, &next);
		}
		/* The relevant patch should already have been initialized. */
		assert(has_patched_distance(&distances, next));
		dist_next = get_patched_distance(&distances, next);
	}
}